

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase
               (ostream *stream,TestCase *test_case)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  internal *this;
  TestResult *this_00;
  TestInfo *pTVar5;
  TimeInMillis ms;
  TestResult *result;
  long in_FS_OFFSET;
  int local_210;
  int i;
  TestCase *test_case_local;
  ostream *stream_local;
  int local_1e8;
  allocator<char> local_1e1;
  int local_1e0;
  allocator<char> local_1d9;
  int local_1d8;
  allocator<char> local_1d4;
  allocator<char> local_1d3;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined1 local_30 [8];
  string kTestsuite;
  
  kTestsuite.field_2._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"testsuite",&local_1d1);
  std::allocator<char>::~allocator(&local_1d1);
  poVar3 = std::operator<<(stream,"  <");
  std::operator<<(poVar3,(string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"name",&local_1d2);
  pcVar4 = TestCase::name(test_case);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar4,&local_1d3);
  OutputXmlAttribute(stream,(string *)local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_1d3);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_1d2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"tests",&local_1d4);
  local_1d8 = TestCase::reportable_test_count(test_case);
  StreamableToString<int>(&local_b0,&local_1d8);
  OutputXmlAttribute(stream,(string *)local_30,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_1d4);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"failures",&local_1d9);
    local_1e0 = TestCase::failed_test_count(test_case);
    StreamableToString<int>(&local_f0,&local_1e0);
    OutputXmlAttribute(stream,(string *)local_30,&local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"disabled",&local_1e1);
    local_1e8 = TestCase::reportable_disabled_test_count(test_case);
    StreamableToString<int>(&local_130,&local_1e8);
    OutputXmlAttribute(stream,(string *)local_30,&local_110,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"errors",(allocator<char> *)((long)&stream_local + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"0",(allocator<char> *)((long)&stream_local + 6));
    OutputXmlAttribute(stream,(string *)local_30,&local_150,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 6));
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"time",(allocator<char> *)((long)&stream_local + 5));
    this = (internal *)TestCase::elapsed_time(test_case);
    FormatTimeInMillisAsSeconds_abi_cxx11_(&local_1b0,this,ms);
    OutputXmlAttribute(stream,(string *)local_30,&local_190,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)((long)&stream_local + 5));
    this_00 = TestCase::ad_hoc_test_result(test_case);
    TestPropertiesAsXmlAttributes_abi_cxx11_(&local_1d0,(XmlUnitTestResultPrinter *)this_00,result);
    std::operator<<(stream,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  std::operator<<(stream,">\n");
  for (local_210 = 0; iVar2 = TestCase::total_test_count(test_case), local_210 < iVar2;
      local_210 = local_210 + 1) {
    pTVar5 = TestCase::GetTestInfo(test_case,local_210);
    bVar1 = TestInfo::is_reportable(pTVar5);
    if (bVar1) {
      pcVar4 = TestCase::name(test_case);
      pTVar5 = TestCase::GetTestInfo(test_case,local_210);
      OutputXmlTestInfo(stream,pcVar4,pTVar5);
    }
  }
  poVar3 = std::operator<<(stream,"  </");
  poVar3 = std::operator<<(poVar3,(string *)local_30);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string((string *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != kTestsuite.field_2._8_8_) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(std::ostream* stream,
                                                const TestCase& test_case) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_case.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_case.reportable_test_count()));
  if (!GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "failures",
                       StreamableToString(test_case.failed_test_count()));
    OutputXmlAttribute(
        stream, kTestsuite, "disabled",
        StreamableToString(test_case.reportable_disabled_test_count()));
    OutputXmlAttribute(stream, kTestsuite, "errors", "0");
    OutputXmlAttribute(stream, kTestsuite, "time",
                       FormatTimeInMillisAsSeconds(test_case.elapsed_time()));
    *stream << TestPropertiesAsXmlAttributes(test_case.ad_hoc_test_result());
  }
  *stream << ">\n";
  for (int i = 0; i < test_case.total_test_count(); ++i) {
    if (test_case.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_case.name(), *test_case.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}